

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment,_3UL>::
         Construct(DB *db,LIST *params)

{
  IfcCompositeCurveSegment *in;
  
  in = (IfcCompositeCurveSegment *)operator_new(0x90);
  *(undefined8 *)&in->field_0x80 = 0;
  *(char **)&in->field_0x88 = "IfcCompositeCurveSegment";
  *(undefined8 *)&(in->super_IfcGeometricRepresentationItem).field_0x28 = 0;
  (in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCompositeCurveSegment_00807638;
  *(undefined ***)&in->field_0x78 = &PTR__IfcCompositeCurveSegment_008076b0;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcCompositeCurveSegment_00807660;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcCompositeCurveSegment_00807688;
  *(undefined1 **)&(in->super_IfcGeometricRepresentationItem).field_0x30 = &in->field_0x40;
  *(undefined8 *)&in->field_0x38 = 0;
  in->field_0x40 = 0;
  (in->SameSense)._M_dataplus._M_p = (pointer)&(in->SameSense).field_2;
  (in->SameSense)._M_string_length = 0;
  (in->SameSense).field_2._M_local_buf[0] = '\0';
  (in->ParentCurve).obj = (LazyObject *)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }